

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O3

uint32_t ivk::cmd_fopen(void *el)

{
  char *pcVar1;
  char *pcVar2;
  char *__filename;
  FILE *dt_00;
  uint32_t uVar3;
  char *hd;
  proc_data dt;
  char *local_70;
  proc_data local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
  local_50;
  
  pcVar1 = get_attr_val((XMLElement **)el,"handle");
  local_70 = pcVar1;
  pcVar2 = get_attr_val((XMLElement **)el,"mode");
  __filename = get_attr_val((XMLElement **)el,"file");
  uVar3 = 5;
  if (__filename != (char *)0x0 && pcVar1 != (char *)0x0) {
    pcVar1 = "wr";
    if (pcVar2 != (char *)0x0) {
      pcVar1 = pcVar2;
    }
    dt_00 = fopen(__filename,pcVar1);
    proc_data::proc_data(&local_68,(char *)dt_00,8,false);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
    ::pair<const_char_*&,_ivk::proc_data_&,_true>(&local_50,&local_70,&local_68);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ivk::proc_data>,std::_Select1st<std::pair<std::__cxx11::string_const,ivk::proc_data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,ivk::proc_data>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ivk::proc_data>,std::_Select1st<std::pair<std::__cxx11::string_const,ivk::proc_data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
                *)gCmdMemMap_abi_cxx11_,&local_50);
    proc_data::~proc_data(&local_50.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
      operator_delete(local_50.first._M_dataplus._M_p);
    }
    proc_data::~proc_data(&local_68);
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint32_t ivk::cmd_fopen(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* hd = get_attr_val(ep,"handle");
    const char* md = get_attr_val(ep,"mode");
    const char* fn = get_attr_val(ep,"file");
    if(!hd || !fn){
        return proc_xml_err;
    }

    FILE* f = fopen(fn, md?md:"wr");
    proc_data dt((char*)f, sizeof(FILE*), false);
    gCmdMemMap.insert(pair<string,proc_data>(hd,dt));

    return proc_success;
}